

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  LY_ERR LVar1;
  char *pcVar2;
  ly_ctx *local_90;
  LY_ERR ret__;
  char *delimiter;
  jsonpr_ctx pctx;
  lyd_node *node;
  uint32_t options_local;
  lyd_node *root_local;
  ly_out *out_local;
  
  memset(&delimiter,0,0x48);
  pcVar2 = "\n";
  if ((options & 2) != 0) {
    pcVar2 = "";
  }
  if (root == (lyd_node *)0x0) {
    ly_print_(out,"{}%s",pcVar2);
    ly_print_flush(out);
  }
  else {
    pctx.root = (lyd_node *)0x0;
    pctx.parent._0_2_ = 1;
    pctx.ctx._0_2_ = 0;
    if (root->schema == (lysc_node *)0x0) {
      local_90 = (ly_ctx *)root[2].schema;
    }
    else {
      local_90 = root->schema->module->ctx;
    }
    pctx._24_8_ = local_90;
    delimiter = (char *)out;
    pctx.parent._4_4_ = options;
    ly_print_(out,"{%s",pcVar2);
    for (pctx.first_leaflist = root; pctx.first_leaflist != (lyd_node *)0x0;
        pctx.first_leaflist = (pctx.first_leaflist)->next) {
      pctx.out = (ly_out *)pctx.first_leaflist;
      LVar1 = json_print_node((jsonpr_ctx *)&delimiter,pctx.first_leaflist);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if ((options & 1) == 0) break;
    }
    ly_print_(out,"%s}%s",pcVar2,pcVar2);
    if (pctx._44_4_ != 0) {
      __assert_fail("!pctx.open.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                    ,0x430,
                    "LY_ERR json_print_data(struct ly_out *, const struct lyd_node *, uint32_t)");
    }
    ly_set_erase((ly_set *)&pctx.level_printed,(_func_void_void_ptr *)0x0);
    ly_print_flush(out);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
json_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    const struct lyd_node *node;
    struct jsonpr_ctx pctx = {0};
    const char *delimiter = (options & LYD_PRINT_SHRINK) ? "" : "\n";

    if (!root) {
        ly_print_(out, "{}%s", delimiter);
        ly_print_flush(out);
        return LY_SUCCESS;
    }

    pctx.out = out;
    pctx.parent = NULL;
    pctx.level = 1;
    pctx.level_printed = 0;
    pctx.options = options;
    pctx.ctx = LYD_CTX(root);

    /* start */
    ly_print_(pctx.out, "{%s", delimiter);

    /* content */
    LY_LIST_FOR(root, node) {
        pctx.root = node;
        LY_CHECK_RET(json_print_node(&pctx, node));
        if (!(options & LYD_PRINT_WITHSIBLINGS)) {
            break;
        }
    }

    /* end */
    ly_print_(out, "%s}%s", delimiter, delimiter);

    assert(!pctx.open.count);
    ly_set_erase(&pctx.open, NULL);

    ly_print_flush(out);
    return LY_SUCCESS;
}